

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O2

void __thiscall
unitNameDefinitions_customaryVector_Test::unitNameDefinitions_customaryVector_Test
          (unitNameDefinitions_customaryVector_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0015e1d0;
  return;
}

Assistant:

TEST(unitNameDefinitions, customaryVector)
{
    for (std::size_t ii = 0; ii < units::defined_unit_names_customary.size();
         ++ii) {
        EXPECT_TRUE(units::defined_unit_names_customary[ii].second != nullptr)
            << ii;
        if (units::defined_unit_names_customary[ii].second == nullptr) {
            break;
        }
    }
}